

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double fpdf(double x,int num,int den)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double z;
  double y;
  double k2;
  double k1;
  double oup;
  int den_local;
  int num_local;
  double x_local;
  
  if ((0 < num) && (0 < den)) {
    if (x < 0.0) {
      printf("The range of distribution only takes non-negative and real values");
      exit(1);
    }
    dVar1 = (double)num;
    dVar2 = (double)den;
    if (dVar1 * x <= dVar2) {
      dVar3 = dVar1 * x + dVar2;
      dVar4 = pow(dVar3,2.0);
      dVar2 = betapdf((dVar1 * x) / (dVar1 * x + dVar2),dVar1 / 2.0,dVar2 / 2.0);
      k1 = ((dVar3 * dVar1 + -(x * dVar1 * dVar1)) / dVar4) * dVar2;
    }
    else {
      dVar3 = betapdf(dVar2 / (dVar1 * x + dVar2),dVar2 / 2.0,dVar1 / 2.0);
      k1 = ((dVar2 * dVar1) / ((dVar1 * x + dVar2) * (dVar1 * x + dVar2))) * dVar3;
    }
    return k1;
  }
  printf("Degrees Of Freedom should be real integers");
  exit(1);
}

Assistant:

double fpdf(double x, int num,int den) {
	double oup,k1,k2,y,z;
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be real integers");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	if ( k1 * x > k2 ) {
		y = (k2 * k1) / ((k2 + k1 * x) * (k2 + k1 * x)) ;
		oup = y * betapdf(k2 / (k2 + k1 * x), k2 / 2.,k1 / 2.);
	} else {
		z = k2 + k1 * x;
		y = (z * k1 - x * k1 * k1) / (pow(z,2.0));
		oup = y * betapdf(k1 * x / (k2 + k1 * x), k1 / 2.,k2 / 2.);
	}
	
	return oup;
}